

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

float * GPU_GetProjection(void)

{
  GPU_Context *pGVar1;
  GPU_Target *pGVar2;
  GPU_MatrixStack *stack;
  GPU_Target *target;
  
  pGVar2 = GPU_GetContextTarget();
  if ((pGVar2 == (GPU_Target *)0x0) || (pGVar2->context == (GPU_Context *)0x0)) {
    target = (GPU_Target *)0x0;
  }
  else {
    pGVar1 = pGVar2->context;
    if ((pGVar1->projection_matrix).size == 0) {
      target = (GPU_Target *)0x0;
    }
    else {
      target = (GPU_Target *)
               (pGVar1->projection_matrix).matrix[(pGVar1->projection_matrix).size - 1];
    }
  }
  return (float *)target;
}

Assistant:

float* GPU_GetProjection(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return NULL;
    stack = &target->context->projection_matrix;
    if(stack->size == 0)
        return NULL;
    return stack->matrix[stack->size-1];
}